

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::Descriptor::DebugString(Descriptor *this,int depth,string *contents)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  Type TVar4;
  int iVar5;
  MessageOptions *options;
  FieldDescriptor *pFVar6;
  size_type sVar7;
  Descriptor *pDVar8;
  string *psVar9;
  EnumDescriptor *this_00;
  ExtensionRange *pEVar10;
  pair<std::_Rb_tree_const_iterator<const_google::protobuf::Descriptor_*>,_bool> pVar11;
  SubstituteArg local_c38;
  SubstituteArg local_c08;
  SubstituteArg local_bd8;
  SubstituteArg local_ba8;
  SubstituteArg local_b78;
  SubstituteArg local_b48;
  SubstituteArg local_b18;
  SubstituteArg local_ae8;
  SubstituteArg local_ab8;
  SubstituteArg local_a88;
  SubstituteArg local_a58;
  SubstituteArg local_a28;
  SubstituteArg local_9f8;
  SubstituteArg local_9c8;
  SubstituteArg local_998;
  SubstituteArg local_968;
  SubstituteArg local_938;
  SubstituteArg local_908;
  SubstituteArg local_8d8;
  SubstituteArg local_8a8;
  SubstituteArg local_878;
  SubstituteArg local_848;
  SubstituteArg local_818;
  SubstituteArg local_7e8;
  SubstituteArg local_7b8;
  SubstituteArg local_788;
  SubstituteArg local_758;
  SubstituteArg local_728;
  SubstituteArg local_6f8;
  SubstituteArg local_6c8;
  SubstituteArg local_698;
  SubstituteArg local_668;
  SubstituteArg local_638;
  SubstituteArg local_608;
  SubstituteArg local_5d8;
  SubstituteArg local_5a8;
  SubstituteArg local_578;
  SubstituteArg local_548;
  SubstituteArg local_518;
  SubstituteArg local_4e8;
  int local_4b4;
  Descriptor *pDStack_4b0;
  int i_6;
  Descriptor *containing_type;
  SubstituteArg local_478;
  SubstituteArg local_448;
  SubstituteArg local_418;
  SubstituteArg local_3e8;
  SubstituteArg local_3b8;
  SubstituteArg local_388;
  SubstituteArg local_358;
  SubstituteArg local_328;
  SubstituteArg local_2f8;
  int local_2c4;
  int local_2c0;
  int i_5;
  int i_4;
  int i_3;
  SubstituteArg local_288;
  SubstituteArg local_258;
  SubstituteArg local_228;
  SubstituteArg local_1f8;
  SubstituteArg local_1c8;
  SubstituteArg local_198;
  SubstituteArg local_168;
  SubstituteArg local_138;
  SubstituteArg local_108;
  Descriptor *local_d8;
  int local_cc;
  _Rb_tree_const_iterator<const_google::protobuf::Descriptor_*> _Stack_c8;
  int i_2;
  undefined1 local_c0;
  Descriptor *local_b8;
  int local_ac;
  _Rb_tree_const_iterator<const_google::protobuf::Descriptor_*> _Stack_a8;
  int i_1;
  undefined1 local_a0;
  Descriptor *local_98;
  int local_8c;
  undefined1 local_88 [4];
  int i;
  set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
  groups;
  allocator<char> local_41;
  undefined1 local_40 [8];
  string prefix;
  string *contents_local;
  int depth_local;
  Descriptor *this_local;
  
  prefix.field_2._8_8_ = contents;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_40,(long)(depth * 2),' ',&local_41);
  std::allocator<char>::~allocator(&local_41);
  iVar2 = depth + 1;
  std::__cxx11::string::append((char *)prefix.field_2._8_8_);
  options = Descriptor::options(this);
  anon_unknown_1::FormatLineOptions(iVar2,&options->super_Message,(string *)prefix.field_2._8_8_);
  std::
  set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
  ::set((set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
         *)local_88);
  local_8c = 0;
  while( true ) {
    iVar5 = local_8c;
    iVar3 = field_count(this);
    if (iVar3 <= iVar5) break;
    pFVar6 = field(this,local_8c);
    TVar4 = FieldDescriptor::type(pFVar6);
    if (TVar4 == TYPE_GROUP) {
      pFVar6 = field(this,local_8c);
      local_98 = FieldDescriptor::message_type(pFVar6);
      pVar11 = std::
               set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
               ::insert((set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                         *)local_88,&local_98);
      _Stack_a8 = pVar11.first._M_node;
      local_a0 = pVar11.second;
    }
    local_8c = local_8c + 1;
  }
  local_ac = 0;
  while( true ) {
    iVar5 = local_ac;
    iVar3 = extension_count(this);
    if (iVar3 <= iVar5) break;
    pFVar6 = extension(this,local_ac);
    TVar4 = FieldDescriptor::type(pFVar6);
    if (TVar4 == TYPE_GROUP) {
      pFVar6 = extension(this,local_ac);
      local_b8 = FieldDescriptor::message_type(pFVar6);
      pVar11 = std::
               set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
               ::insert((set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                         *)local_88,&local_b8);
      _Stack_c8 = pVar11.first._M_node;
      local_c0 = pVar11.second;
    }
    local_ac = local_ac + 1;
  }
  local_cc = 0;
  while( true ) {
    iVar5 = local_cc;
    iVar3 = nested_type_count(this);
    if (iVar3 <= iVar5) break;
    local_d8 = nested_type(this,local_cc);
    sVar7 = std::
            set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
            ::count((set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                     *)local_88,&local_d8);
    uVar1 = prefix.field_2._8_8_;
    if (sVar7 == 0) {
      strings::internal::SubstituteArg::SubstituteArg(&local_108,(string *)local_40);
      pDVar8 = nested_type(this,local_cc);
      psVar9 = name_abi_cxx11_(pDVar8);
      strings::internal::SubstituteArg::SubstituteArg(&local_138,psVar9);
      strings::internal::SubstituteArg::SubstituteArg(&local_168);
      strings::internal::SubstituteArg::SubstituteArg(&local_198);
      strings::internal::SubstituteArg::SubstituteArg(&local_1c8);
      strings::internal::SubstituteArg::SubstituteArg(&local_1f8);
      strings::internal::SubstituteArg::SubstituteArg(&local_228);
      strings::internal::SubstituteArg::SubstituteArg(&local_258);
      strings::internal::SubstituteArg::SubstituteArg(&local_288);
      strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)&i_4);
      strings::SubstituteAndAppend
                ((string *)uVar1,"$0  message $1",&local_108,&local_138,&local_168,&local_198,
                 &local_1c8,&local_1f8,&local_228,&local_258,&local_288,(SubstituteArg *)&i_4);
      pDVar8 = nested_type(this,local_cc);
      DebugString(pDVar8,iVar2,(string *)prefix.field_2._8_8_);
    }
    local_cc = local_cc + 1;
  }
  i_5 = 0;
  while( true ) {
    iVar5 = i_5;
    iVar3 = enum_type_count(this);
    if (iVar3 <= iVar5) break;
    this_00 = enum_type(this,i_5);
    EnumDescriptor::DebugString(this_00,iVar2,(string *)prefix.field_2._8_8_);
    i_5 = i_5 + 1;
  }
  local_2c0 = 0;
  while( true ) {
    iVar5 = local_2c0;
    iVar3 = field_count(this);
    if (iVar3 <= iVar5) break;
    pFVar6 = field(this,local_2c0);
    FieldDescriptor::DebugString(pFVar6,iVar2,(string *)prefix.field_2._8_8_);
    local_2c0 = local_2c0 + 1;
  }
  local_2c4 = 0;
  while( true ) {
    iVar2 = local_2c4;
    iVar5 = extension_range_count(this);
    uVar1 = prefix.field_2._8_8_;
    if (iVar5 <= iVar2) break;
    strings::internal::SubstituteArg::SubstituteArg(&local_2f8,(string *)local_40);
    pEVar10 = extension_range(this,local_2c4);
    strings::internal::SubstituteArg::SubstituteArg(&local_328,pEVar10->start);
    pEVar10 = extension_range(this,local_2c4);
    strings::internal::SubstituteArg::SubstituteArg(&local_358,pEVar10->end + -1);
    strings::internal::SubstituteArg::SubstituteArg(&local_388);
    strings::internal::SubstituteArg::SubstituteArg(&local_3b8);
    strings::internal::SubstituteArg::SubstituteArg(&local_3e8);
    strings::internal::SubstituteArg::SubstituteArg(&local_418);
    strings::internal::SubstituteArg::SubstituteArg(&local_448);
    strings::internal::SubstituteArg::SubstituteArg(&local_478);
    strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)&containing_type);
    strings::SubstituteAndAppend
              ((string *)uVar1,"$0  extensions $1 to $2;\n",&local_2f8,&local_328,&local_358,
               &local_388,&local_3b8,&local_3e8,&local_418,&local_448,&local_478,
               (SubstituteArg *)&containing_type);
    local_2c4 = local_2c4 + 1;
  }
  pDStack_4b0 = (Descriptor *)0x0;
  local_4b4 = 0;
  while( true ) {
    iVar2 = local_4b4;
    iVar5 = extension_count(this);
    if (iVar5 <= iVar2) break;
    pFVar6 = extension(this,local_4b4);
    pDVar8 = FieldDescriptor::containing_type(pFVar6);
    uVar1 = prefix.field_2._8_8_;
    if (pDVar8 != pDStack_4b0) {
      if (0 < local_4b4) {
        strings::internal::SubstituteArg::SubstituteArg(&local_4e8,(string *)local_40);
        strings::internal::SubstituteArg::SubstituteArg(&local_518);
        strings::internal::SubstituteArg::SubstituteArg(&local_548);
        strings::internal::SubstituteArg::SubstituteArg(&local_578);
        strings::internal::SubstituteArg::SubstituteArg(&local_5a8);
        strings::internal::SubstituteArg::SubstituteArg(&local_5d8);
        strings::internal::SubstituteArg::SubstituteArg(&local_608);
        strings::internal::SubstituteArg::SubstituteArg(&local_638);
        strings::internal::SubstituteArg::SubstituteArg(&local_668);
        strings::internal::SubstituteArg::SubstituteArg(&local_698);
        strings::SubstituteAndAppend
                  ((string *)uVar1,"$0  }\n",&local_4e8,&local_518,&local_548,&local_578,&local_5a8,
                   &local_5d8,&local_608,&local_638,&local_668,&local_698);
      }
      pFVar6 = extension(this,local_4b4);
      pDStack_4b0 = FieldDescriptor::containing_type(pFVar6);
      uVar1 = prefix.field_2._8_8_;
      strings::internal::SubstituteArg::SubstituteArg(&local_6c8,(string *)local_40);
      psVar9 = full_name_abi_cxx11_(pDStack_4b0);
      strings::internal::SubstituteArg::SubstituteArg(&local_6f8,psVar9);
      strings::internal::SubstituteArg::SubstituteArg(&local_728);
      strings::internal::SubstituteArg::SubstituteArg(&local_758);
      strings::internal::SubstituteArg::SubstituteArg(&local_788);
      strings::internal::SubstituteArg::SubstituteArg(&local_7b8);
      strings::internal::SubstituteArg::SubstituteArg(&local_7e8);
      strings::internal::SubstituteArg::SubstituteArg(&local_818);
      strings::internal::SubstituteArg::SubstituteArg(&local_848);
      strings::internal::SubstituteArg::SubstituteArg(&local_878);
      strings::SubstituteAndAppend
                ((string *)uVar1,"$0  extend .$1 {\n",&local_6c8,&local_6f8,&local_728,&local_758,
                 &local_788,&local_7b8,&local_7e8,&local_818,&local_848,&local_878);
    }
    pFVar6 = extension(this,local_4b4);
    FieldDescriptor::DebugString(pFVar6,depth + 2,(string *)prefix.field_2._8_8_);
    local_4b4 = local_4b4 + 1;
  }
  iVar2 = extension_count(this);
  uVar1 = prefix.field_2._8_8_;
  if (0 < iVar2) {
    strings::internal::SubstituteArg::SubstituteArg(&local_8a8,(string *)local_40);
    strings::internal::SubstituteArg::SubstituteArg(&local_8d8);
    strings::internal::SubstituteArg::SubstituteArg(&local_908);
    strings::internal::SubstituteArg::SubstituteArg(&local_938);
    strings::internal::SubstituteArg::SubstituteArg(&local_968);
    strings::internal::SubstituteArg::SubstituteArg(&local_998);
    strings::internal::SubstituteArg::SubstituteArg(&local_9c8);
    strings::internal::SubstituteArg::SubstituteArg(&local_9f8);
    strings::internal::SubstituteArg::SubstituteArg(&local_a28);
    strings::internal::SubstituteArg::SubstituteArg(&local_a58);
    strings::SubstituteAndAppend
              ((string *)uVar1,"$0  }\n",&local_8a8,&local_8d8,&local_908,&local_938,&local_968,
               &local_998,&local_9c8,&local_9f8,&local_a28,&local_a58);
  }
  uVar1 = prefix.field_2._8_8_;
  strings::internal::SubstituteArg::SubstituteArg(&local_a88,(string *)local_40);
  strings::internal::SubstituteArg::SubstituteArg(&local_ab8);
  strings::internal::SubstituteArg::SubstituteArg(&local_ae8);
  strings::internal::SubstituteArg::SubstituteArg(&local_b18);
  strings::internal::SubstituteArg::SubstituteArg(&local_b48);
  strings::internal::SubstituteArg::SubstituteArg(&local_b78);
  strings::internal::SubstituteArg::SubstituteArg(&local_ba8);
  strings::internal::SubstituteArg::SubstituteArg(&local_bd8);
  strings::internal::SubstituteArg::SubstituteArg(&local_c08);
  strings::internal::SubstituteArg::SubstituteArg(&local_c38);
  strings::SubstituteAndAppend
            ((string *)uVar1,"$0}\n",&local_a88,&local_ab8,&local_ae8,&local_b18,&local_b48,
             &local_b78,&local_ba8,&local_bd8,&local_c08,&local_c38);
  std::
  set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
  ::~set((set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
          *)local_88);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void Descriptor::DebugString(int depth, string *contents) const {
  string prefix(depth * 2, ' ');
  ++depth;
  contents->append(" {\n");

  FormatLineOptions(depth, options(), contents);

  // Find all the 'group' types for fields and extensions; we will not output
  // their nested definitions (those will be done with their group field
  // descriptor).
  set<const Descriptor*> groups;
  for (int i = 0; i < field_count(); i++) {
    if (field(i)->type() == FieldDescriptor::TYPE_GROUP) {
      groups.insert(field(i)->message_type());
    }
  }
  for (int i = 0; i < extension_count(); i++) {
    if (extension(i)->type() == FieldDescriptor::TYPE_GROUP) {
      groups.insert(extension(i)->message_type());
    }
  }

  for (int i = 0; i < nested_type_count(); i++) {
    if (groups.count(nested_type(i)) == 0) {
      strings::SubstituteAndAppend(contents, "$0  message $1",
                                   prefix, nested_type(i)->name());
      nested_type(i)->DebugString(depth, contents);
    }
  }
  for (int i = 0; i < enum_type_count(); i++) {
    enum_type(i)->DebugString(depth, contents);
  }
  for (int i = 0; i < field_count(); i++) {
    field(i)->DebugString(depth, contents);
  }

  for (int i = 0; i < extension_range_count(); i++) {
    strings::SubstituteAndAppend(contents, "$0  extensions $1 to $2;\n",
                                 prefix,
                                 extension_range(i)->start,
                                 extension_range(i)->end - 1);
  }

  // Group extensions by what they extend, so they can be printed out together.
  const Descriptor* containing_type = NULL;
  for (int i = 0; i < extension_count(); i++) {
    if (extension(i)->containing_type() != containing_type) {
      if (i > 0) strings::SubstituteAndAppend(contents, "$0  }\n", prefix);
      containing_type = extension(i)->containing_type();
      strings::SubstituteAndAppend(contents, "$0  extend .$1 {\n",
                                   prefix, containing_type->full_name());
    }
    extension(i)->DebugString(depth + 1, contents);
  }
  if (extension_count() > 0)
    strings::SubstituteAndAppend(contents, "$0  }\n", prefix);

  strings::SubstituteAndAppend(contents, "$0}\n", prefix);
}